

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O1

void __thiscall
TEST_MockSupport_c_expectAndActualParameters_Test::
~TEST_MockSupport_c_expectAndActualParameters_Test
          (TEST_MockSupport_c_expectAndActualParameters_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockSupport_c, expectAndActualParameters)
{
    mock_c()->expectOneCall("boo")->withIntParameters("integer", 1)->withDoubleParameters("double", 1.0)->
            withStringParameters("string", "string")->withPointerParameters("pointer", (void*) 1)->
            withFunctionPointerParameters("functionPointer", dummy_function_for_mock_c_test);
    mock_c()->actualCall("boo")->withIntParameters("integer", 1)->withDoubleParameters("double", 1.0)->
            withStringParameters("string", "string")->withPointerParameters("pointer", (void*) 1)->
            withFunctionPointerParameters("functionPointer", dummy_function_for_mock_c_test);
}